

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O2

bool __thiscall draco::PlyReader::ParsePropertiesData(PlyReader *this,DecoderBuffer *buffer)

{
  bool bVar1;
  int i;
  int element_index;
  int iVar2;
  
  for (element_index = 0;
      iVar2 = (int)(((long)(this->elements_).
                           super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->elements_).
                          super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x70), element_index < iVar2;
      element_index = element_index + 1) {
    if (this->format_ == kAscii) {
      bVar1 = ParseElementDataAscii(this,buffer,element_index);
      if (!bVar1) break;
    }
    else if (this->format_ == kLittleEndian) {
      ParseElementData(this,buffer,element_index);
    }
  }
  return iVar2 <= element_index;
}

Assistant:

bool PlyReader::ParsePropertiesData(DecoderBuffer *buffer) {
  for (int i = 0; i < static_cast<int>(elements_.size()); ++i) {
    if (format_ == kLittleEndian) {
      if (!ParseElementData(buffer, i)) {
        return false;
      }
    } else if (format_ == kAscii) {
      if (!ParseElementDataAscii(buffer, i)) {
        return false;
      }
    }
  }
  return true;
}